

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void ** __thiscall
TCMallocImplementation::ReadStackTraces(TCMallocImplementation *this,int *sample_period)

{
  int iVar1;
  void **ppvVar2;
  undefined1 *puVar3;
  ThreadCachePtr TVar4;
  undefined1 local_48 [8];
  StackTraceTable table;
  SpinLockHolder h;
  
  local_48[0] = false;
  table.error_ = false;
  table._1_7_ = 0;
  table._16_8_ = 0x162540;
  SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  puVar3 = tcmalloc::Static::sampled_objects_;
  while (puVar3 = *(undefined1 **)(puVar3 + 0x10), puVar3 != tcmalloc::Static::sampled_objects_) {
    tcmalloc::StackTraceTable::AddTrace((StackTraceTable *)local_48,*(StackTrace **)(puVar3 + 0x20))
    ;
  }
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&table.field_0x10);
  TVar4 = tcmalloc::ThreadCachePtr::Grab();
  iVar1 = tcmalloc::ThreadCache::GetSamplePeriod(TVar4.ptr_);
  *sample_period = iVar1;
  ppvVar2 = tcmalloc::StackTraceTable::ReadStackTracesAndClear((StackTraceTable *)local_48);
  return ppvVar2;
}

Assistant:

virtual void** ReadStackTraces(int* sample_period) {
    tcmalloc::StackTraceTable table;
    {
      SpinLockHolder h(Static::pageheap_lock());
      Span* sampled = Static::sampled_objects();
      for (Span* s = sampled->next; s != sampled; s = s->next) {
        table.AddTrace(*reinterpret_cast<StackTrace*>(s->objects));
      }
    }
    *sample_period = ThreadCachePtr::Grab()->GetSamplePeriod();
    return table.ReadStackTracesAndClear(); // grabs and releases pageheap_lock
  }